

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O1

void __thiscall
SuiteFieldConvertorsTests::TestutcTimeStampConvertToNano::RunImpl
          (TestutcTimeStampConvertToNano *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int in_ECX;
  int precision;
  TestDetails *details;
  UtcTimeStamp input;
  string local_60;
  undefined **local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  TestDetails local_28;
  
  FIX::DateTime::nowUtc();
  local_40 = &PTR__DateTime_00326368;
  uStack_30 = 0x2791a8ca0ee3;
  _local_38 = CONCAT44(local_60._M_string_length._4_4_,0x2568cd);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_60,(UtcTimeStampConvertor *)&local_40,(UtcTimeStamp *)0x0,in_ECX);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x10e);
  details = &local_28;
  UnitTest::CheckEqual<char[18],std::__cxx11::string>
            (pTVar1,(char (*) [18])"20000426-12:05:06",&local_60,details);
  precision = (int)details;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_60,(UtcTimeStampConvertor *)&local_40,(UtcTimeStamp *)0x9,precision);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x10f);
  UnitTest::CheckEqual<char[28],std::__cxx11::string>
            (pTVar1,(char (*) [28])"20000426-12:05:06.555555555",&local_60,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(utcTimeStampConvertToNano)
{
  UtcTimeStamp input;
  input.setHMS( 12, 5, 6, 555555555, 9 );
  input.setYMD( 2000, 4, 26 );
  CHECK_EQUAL( "20000426-12:05:06", UtcTimeStampConvertor::convert( input ) );
  CHECK_EQUAL( "20000426-12:05:06.555555555", UtcTimeStampConvertor::convert( input, 9 ) );
}